

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedentity.cpp
# Opt level: O0

bool __thiscall libcellml::NamedEntity::doEquals(NamedEntity *this,EntityPtr *other)

{
  bool bVar1;
  NamedEntityImpl *pNVar2;
  element_type *this_00;
  string local_60;
  undefined1 local_30 [8];
  shared_ptr<libcellml::NamedEntity> namedEntity;
  EntityPtr *other_local;
  NamedEntity *this_local;
  
  namedEntity.super___shared_ptr<libcellml::NamedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)other;
  bVar1 = Entity::doEquals((Entity *)this,other);
  if (bVar1) {
    std::dynamic_pointer_cast<libcellml::NamedEntity,libcellml::Entity>
              ((shared_ptr<libcellml::Entity> *)local_30);
    bVar1 = std::operator!=((shared_ptr<libcellml::NamedEntity> *)local_30,(nullptr_t)0x0);
    if (bVar1) {
      pNVar2 = pFunc(this);
      this_00 = std::
                __shared_ptr_access<libcellml::NamedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::NamedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_30);
      name_abi_cxx11_(&local_60,this_00);
      this_local._7_1_ = std::operator==(&pNVar2->mName,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::shared_ptr<libcellml::NamedEntity>::~shared_ptr
              ((shared_ptr<libcellml::NamedEntity> *)local_30);
    if (bVar1) goto LAB_00327fdb;
  }
  this_local._7_1_ = 0;
LAB_00327fdb:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool NamedEntity::doEquals(const EntityPtr &other) const
{
    if (Entity::doEquals(other)) {
        auto namedEntity = std::dynamic_pointer_cast<NamedEntity>(other);
        if (namedEntity != nullptr) {
            return pFunc()->mName == namedEntity->name();
        }
    }
    return false;
}